

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O1

void __thiscall
Diligent::anon_unknown_0::DXCompilerImpl::Compile
          (DXCompilerImpl *this,ShaderCreateInfo *ShaderCI,ShaderVersion ShaderModel,char *Preamble,
          IDxcBlob **ppByteCodeBlob,vector<unsigned_int,_std::allocator<unsigned_int>_> *pByteCode,
          IDataBlob **ppCompilerOutput)

{
  DXCompilerLibrary *this_00;
  CComPtr<IDxcBlob> CVar1;
  bool bVar2;
  DxcCreateInstanceProc p_Var3;
  ShaderVersion SVar4;
  size_t sVar5;
  Version VVar6;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *pcVar10;
  ShaderVersion ShaderModel_00;
  wchar_t *pwVar11;
  ShaderCreateInfo *ShaderCI_00;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  SHADER_TYPE ShaderType;
  uint uVar15;
  CComPtr<IDxcBlob> pDXIL;
  CComPtr<IDxcBlob> pDxcLog;
  vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> DxilArgs;
  CompileAttribs CA;
  String Source;
  wstring wstrEntryPoint;
  DxcDefine Defines [1];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  wstring wstrProfile;
  String Profile;
  
  this_00 = &this->m_Library;
  pcVar10 = Preamble;
  p_Var3 = DXCompilerLibrary::GetDxcCreateInstance(this_00);
  if (p_Var3 == (DxcCreateInstanceProc)0x0) {
    FormatString<char[26]>((string *)&CA,(char (*) [26])"DX compiler is not loaded");
    DebugAssertionFailed
              (CA.Source,"Compile",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
               ,0x2ba);
    Profile.field_2._M_allocated_capacity = (size_type)CA.EntryPoint;
    pcVar10 = CA.Source;
    if ((wchar_t **)CA.Source == &CA.EntryPoint) {
      return;
    }
    goto LAB_00355762;
  }
  uVar12 = ShaderModel.Minor;
  DXCompilerLibrary::GetDxcCreateInstance(this_00);
  SVar4 = DXCompilerLibrary::GetMaxShaderModel(this_00);
  uVar15 = SVar4.Minor;
  uVar14 = ShaderModel.Major;
  ShaderModel_00._1_7_ = SUB87((ulong)pcVar10 >> 8,0);
  ShaderModel_00.Major._0_1_ = (ulong)ShaderModel >> 0x20 != 0 || uVar14 != 0;
  uVar13 = SVar4.Major;
  if (ShaderModel_00.Major._0_1_) {
    if (uVar14 < 6) {
      ShaderModel_00 = (ShaderVersion)&wstrEntryPoint;
      wstrEntryPoint._M_dataplus._M_p._0_1_ = 0x5f;
      wstrProfile._M_dataplus._M_p._0_4_ = uVar12;
      Profile._M_dataplus._M_p._0_4_ = uVar14;
      FormatString<char[75],unsigned_int,char,unsigned_int,char[8]>
                ((string *)&CA,
                 (Diligent *)
                 "DXC only supports shader model 6.0+. Upgrading the specified shader model ",
                 (char (*) [75])&Profile,(uint *)ShaderModel_00,(char *)&wstrProfile,
                 (uint *)" to 6_0",(char (*) [8])pDXIL.super_CComPtrBase<IDxcBlob>.p);
      if (DebugMessageCallback != (undefined *)0x0) {
        ShaderModel_00.Major = 0;
        ShaderModel_00.Minor = 0;
        (*(code *)DebugMessageCallback)(0,CA.Source,0,0,0);
      }
      if ((wchar_t **)CA.Source != &CA.EntryPoint) {
        operator_delete(CA.Source,(long)CA.EntryPoint + 1);
      }
      uVar12 = 0;
      ShaderModel.Major = 6;
      ShaderModel.Minor = 0;
    }
    else {
      ShaderModel_00._1_7_ = 0;
      ShaderModel_00.Major._0_1_ = uVar13 < uVar14;
      bVar2 = uVar15 < uVar12;
      if (uVar14 != uVar13) {
        bVar2 = uVar13 < uVar14;
      }
      if (bVar2) {
        ShaderModel_00 = (ShaderVersion)Defines;
        Defines[0].Name = (LPCWSTR)CONCAT71(Defines[0].Name._1_7_,0x5f);
        wstrProfile._M_dataplus._M_p._0_4_ = uVar15;
        wstrEntryPoint._M_dataplus._M_p._0_4_ = uVar14;
        DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(DxilArgs.
                               super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x5f);
        Source._M_dataplus._M_p._0_4_ = uVar12;
        Profile._M_dataplus._M_p._0_4_ = uVar13;
        FormatString<char[46],unsigned_int,char,unsigned_int,char[30],unsigned_int,char,unsigned_int,char[21]>
                  ((string *)&CA,(Diligent *)"The maximum supported shader model by DXC is ",
                   (char (*) [46])&Profile,(uint *)ShaderModel_00,(char *)&wstrProfile,
                   (uint *)". The specified shader model ",(char (*) [30])&wstrEntryPoint,
                   (uint *)&DxilArgs,(char *)&Source,(uint *)" will be downgraded.",
                   (char (*) [21])pDXIL.super_CComPtrBase<IDxcBlob>.p);
        if (DebugMessageCallback != (undefined *)0x0) {
          ShaderModel_00.Major = 0;
          ShaderModel_00.Minor = 0;
          (*(code *)DebugMessageCallback)(1,CA.Source,0,0,0);
        }
        if ((wchar_t **)CA.Source != &CA.EntryPoint) {
          operator_delete(CA.Source,(long)CA.EntryPoint + 1);
        }
        goto LAB_003550c0;
      }
    }
  }
  else {
LAB_003550c0:
    ShaderModel = (ShaderVersion)((ulong)SVar4 & 0xffffffff);
    uVar12 = uVar15;
  }
  ShaderType = ShaderModel.Major;
  GetHLSLProfileString_abi_cxx11_
            (&Profile,(Diligent *)(ulong)(ShaderCI->Desc).ShaderType,ShaderType,ShaderModel_00);
  wstrProfile._M_dataplus._M_p = (pointer)&wstrProfile.field_2;
  std::__cxx11::wstring::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((wstring *)&wstrProfile,
             CONCAT44(Profile._M_dataplus._M_p._4_4_,(uint)Profile._M_dataplus._M_p),
             Profile._M_string_length +
             CONCAT44(Profile._M_dataplus._M_p._4_4_,(uint)Profile._M_dataplus._M_p));
  pcVar10 = ShaderCI->EntryPoint;
  sVar5 = strlen(pcVar10);
  wstrEntryPoint._M_dataplus._M_p = (pointer)&wstrEntryPoint.field_2;
  std::__cxx11::wstring::_M_construct<char_const*>
            ((wstring *)&wstrEntryPoint,pcVar10,pcVar10 + sVar5);
  DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this_00->m_Target == Vulkan) {
    CA.EntryPoint = L"-Od";
    CA.Source = "-spirv";
    CA.SourceLength = 0x83dc8c;
    CA._12_4_ = 0;
    std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::_M_assign_aux<wchar_t_const*const*>
              ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,&CA);
    if (0x401fff < this->m_APIVersion) {
      bVar2 = (SHADER_TYPE_GEOMETRY|SHADER_TYPE_VERTEX) < ShaderType;
      if (ShaderType == (SHADER_TYPE_GEOMETRY|SHADER_TYPE_PIXEL)) {
        bVar2 = 2 < uVar12;
      }
      if (bVar2) {
        CA.Source = "-fspv-target-env=vulkan1.2";
        std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
                  ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,
                   (wchar_t **)&CA);
        goto LAB_0035545b;
      }
    }
    if (0x400fff < this->m_APIVersion) {
      CA.Source = "-fspv-target-env=vulkan1.1";
      std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
                ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,(wchar_t **)&CA)
      ;
    }
  }
  else if (this_00->m_Target == Direct3D12) {
    CA.Source = "-Zi";
    std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
              ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,(wchar_t **)&CA);
    CA.Source = "-Od";
    std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
              ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,(wchar_t **)&CA);
    VVar6 = DXCompilerLibrary::GetVersion(this_00);
    bVar2 = 4 < VVar6.Minor;
    if (VVar6.Major != 1) {
      bVar2 = VVar6.Major != 0;
    }
    if (bVar2) {
      CA.Source = "-Qembed_debug";
      std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
                ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,(wchar_t **)&CA)
      ;
    }
  }
  else {
    FormatString<char[24]>((string *)&CA,(char (*) [24])"Unknown compiler target");
    DebugAssertionFailed
              (CA.Source,"Compile",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
               ,0x305);
    if ((wchar_t **)CA.Source != &CA.EntryPoint) {
      operator_delete(CA.Source,(long)CA.EntryPoint + 1);
    }
  }
LAB_0035545b:
  pwVar11 = L"-Zpr";
  if ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR) ==
      SHADER_COMPILE_FLAG_NONE) {
    pwVar11 = L"-Zpc";
  }
  CA.Source = (char *)pwVar11;
  std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
            ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,(wchar_t **)&CA);
  pDXIL.super_CComPtrBase<IDxcBlob>.p = (CComPtrBase<IDxcBlob>)(IDxcBlob *)0x0;
  pDxcLog.super_CComPtrBase<IDxcBlob>.p = (CComPtrBase<IDxcBlob>)(IDxcBlob *)0x0;
  CA.Source = (char *)0x0;
  CA.SourceLength = 0;
  CA.pArgs = (wchar_t **)0x0;
  CA.ArgsCount = 0;
  CA.EntryPoint = (wchar_t *)0x0;
  CA.Profile._0_4_ = 0;
  CA.Profile._4_4_ = 0;
  CA.pDefines._0_4_ = 0;
  CA.pDefines._4_4_ = 0;
  CA.DefinesCount = 0;
  CA.pShaderSourceStreamFactory = (IShaderSourceInputStreamFactory *)0x0;
  CA.ppBlobOut = (IDxcBlob **)0x0;
  CA.ppCompilerOutput = (IDxcBlob **)0x0;
  pcVar10 = "";
  if (Preamble != (char *)0x0) {
    pcVar10 = Preamble;
  }
  Source._M_dataplus._M_p = (pointer)&Source.field_2;
  sVar5 = strlen(pcVar10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&Source,pcVar10,pcVar10 + sVar5);
  BuildHLSLSourceString_abi_cxx11_((String *)Defines,(Diligent *)ShaderCI,ShaderCI_00);
  std::__cxx11::string::_M_append((char *)&Source,(ulong)Defines[0].Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)Defines[0].Name != &local_98) {
    operator_delete(Defines[0].Name,local_98._M_allocated_capacity + 1);
  }
  Defines[0].Name = L"DXCOMPILER";
  Defines[0].Value = L"1";
  CA.Source = Source._M_dataplus._M_p;
  CA.SourceLength = (Uint32)Source._M_string_length;
  CA.EntryPoint = wstrEntryPoint._M_dataplus._M_p;
  CA.Profile._0_4_ = SUB84(wstrProfile._M_dataplus._M_p,0);
  CA.Profile._4_4_ = (undefined4)((ulong)wstrProfile._M_dataplus._M_p >> 0x20);
  CA.DefinesCount = 1;
  CA.pArgs = DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  CA.ArgsCount = (Uint32)((ulong)((long)DxilArgs.
                                        super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)DxilArgs.
                                       super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
  CA.pShaderSourceStreamFactory = ShaderCI->pShaderSourceStreamFactory;
  CA.pDefines = Defines;
  if ((pDXIL.super_CComPtrBase<IDxcBlob>.p != (IDxcBlob *)0x0) ||
     (CA.ppBlobOut = (IDxcBlob **)&pDXIL, pDxcLog.super_CComPtrBase<IDxcBlob>.p != (IDxcBlob *)0x0))
  {
    __assert_fail("p == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/../../ThirdParty/DirectXShaderCompiler/dxc/WinAdapter.h"
                  ,0x29d,"T **CComPtrBase<IDxcBlob>::operator&() [T = IDxcBlob]");
  }
  CA.ppCompilerOutput = (IDxcBlob **)&pDxcLog;
  CA.ppBlobOut = (IDxcBlob **)&pDXIL;
  bVar2 = Compile(this,&CA);
  HandleHLSLCompilerResult<IDxcBlob>
            (bVar2,(IDxcBlob *)pDxcLog.super_CComPtrBase<IDxcBlob>.p,&Source,
             (ShaderCI->Desc).super_DeviceObjectAttribs.Name,ppCompilerOutput);
  if ((bVar2) && (pDXIL.super_CComPtrBase<IDxcBlob>.p != (IDxcBlob *)0x0)) {
    lVar7 = (**(code **)(*(long *)pDXIL.super_CComPtrBase<IDxcBlob>.p + 0x20))();
    if (lVar7 != 0) {
      if (pByteCode != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        uVar8 = (**(code **)(*(long *)pDXIL.super_CComPtrBase<IDxcBlob>.p + 0x18))();
        lVar7 = (**(code **)(*(long *)pDXIL.super_CComPtrBase<IDxcBlob>.p + 0x18))();
        uVar9 = (**(code **)(*(long *)pDXIL.super_CComPtrBase<IDxcBlob>.p + 0x20))();
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)pByteCode,uVar8,
                   lVar7 + (uVar9 & 0xfffffffffffffffc));
      }
      CVar1.super_CComPtrBase<IDxcBlob>.p = pDXIL.super_CComPtrBase<IDxcBlob>.p;
      if (ppByteCodeBlob != (IDxcBlob **)0x0) {
        pDXIL.super_CComPtrBase<IDxcBlob>.p = (CComPtrBase<IDxcBlob>)(IDxcBlob *)0x0;
        *ppByteCodeBlob = (IDxcBlob *)CVar1.super_CComPtrBase<IDxcBlob>.p;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)Source._M_dataplus._M_p != &Source.field_2) {
    operator_delete(Source._M_dataplus._M_p,Source.field_2._M_allocated_capacity + 1);
  }
  if (pDxcLog.super_CComPtrBase<IDxcBlob>.p != (IDxcBlob *)0x0) {
    (**(code **)(*(long *)pDxcLog.super_CComPtrBase<IDxcBlob>.p + 0x10))();
    pDxcLog.super_CComPtrBase<IDxcBlob>.p = (CComPtrBase<IDxcBlob>)(IDxcBlob *)0x0;
  }
  if (pDXIL.super_CComPtrBase<IDxcBlob>.p != (IDxcBlob *)0x0) {
    (**(code **)(*(long *)pDXIL.super_CComPtrBase<IDxcBlob>.p + 0x10))();
    pDXIL.super_CComPtrBase<IDxcBlob>.p = (CComPtrBase<IDxcBlob>)(IDxcBlob *)0x0;
  }
  if (DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)DxilArgs.
                          super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)DxilArgs.
                          super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)wstrEntryPoint._M_dataplus._M_p != &wstrEntryPoint.field_2) {
    operator_delete(wstrEntryPoint._M_dataplus._M_p,
                    wstrEntryPoint.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)wstrProfile._M_dataplus._M_p != &wstrProfile.field_2) {
    operator_delete(wstrProfile._M_dataplus._M_p,wstrProfile.field_2._M_allocated_capacity * 4 + 4);
  }
  pcVar10 = (char *)CONCAT44(Profile._M_dataplus._M_p._4_4_,(uint)Profile._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar10 == &Profile.field_2) {
    return;
  }
LAB_00355762:
  operator_delete(pcVar10,Profile.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void DXCompilerImpl::Compile(const ShaderCreateInfo& ShaderCI,
                             ShaderVersion           ShaderModel,
                             const char*             Preamble,
                             IDxcBlob**              ppByteCodeBlob,
                             std::vector<uint32_t>*  pByteCode,
                             IDataBlob**             ppCompilerOutput) noexcept(false)
{
    if (!IsLoaded())
    {
        UNEXPECTED("DX compiler is not loaded");
        return;
    }

    ShaderVersion MaxSM = GetMaxShaderModel();

    // validate shader version
    if (ShaderModel == ShaderVersion{})
    {
        ShaderModel = MaxSM;
    }
    else if (ShaderModel.Major < 6)
    {
        LOG_INFO_MESSAGE("DXC only supports shader model 6.0+. Upgrading the specified shader model ",
                         Uint32{ShaderModel.Major}, '_', Uint32{ShaderModel.Minor}, " to 6_0");
        ShaderModel = ShaderVersion{6, 0};
    }
    else if (ShaderModel > MaxSM)
    {
        LOG_WARNING_MESSAGE("The maximum supported shader model by DXC is ", Uint32{MaxSM.Major}, '_', Uint32{MaxSM.Minor},
                            ". The specified shader model ", Uint32{ShaderModel.Major}, '_', Uint32{ShaderModel.Minor}, " will be downgraded.");
        ShaderModel = MaxSM;
    }

    const String       Profile = GetHLSLProfileString(ShaderCI.Desc.ShaderType, ShaderModel);
    const std::wstring wstrProfile{Profile.begin(), Profile.end()};
    const std::wstring wstrEntryPoint{ShaderCI.EntryPoint, ShaderCI.EntryPoint + strlen(ShaderCI.EntryPoint)};

    std::vector<const wchar_t*> DxilArgs;
    if (m_Library.GetTarget() == DXCompilerTarget::Direct3D12)
    {
        //DxilArgs.push_back(L"-WX");  // Warnings as errors
#ifdef DILIGENT_DEBUG
        DxilArgs.push_back(DXC_ARG_DEBUG);              // Debug info
        DxilArgs.push_back(DXC_ARG_SKIP_OPTIMIZATIONS); // Disable optimization
        if (m_Library.GetVersion() >= Version{1, 5})
        {
            // Silence the following warning:
            // no output provided for debug - embedding PDB in shader container.  Use -Qembed_debug to silence this warning.
            DxilArgs.push_back(L"-Qembed_debug");
        }
#else
        if (m_Library.GetVersion() >= Version{1, 5})
            DxilArgs.push_back(DXC_ARG_OPTIMIZATION_LEVEL3); // Optimization level 3
        else
            DxilArgs.push_back(DXC_ARG_SKIP_OPTIMIZATIONS); // TODO: something goes wrong if optimization is enabled
#endif
    }
    else if (m_Library.GetTarget() == DXCompilerTarget::Vulkan)
    {
        DxilArgs.assign(
            {
                L"-spirv",
                L"-fspv-reflect",
#ifdef DILIGENT_DEBUG
                DXC_ARG_SKIP_OPTIMIZATIONS,
#else
                DXC_ARG_OPTIMIZATION_LEVEL3
#endif
            });

        if (m_APIVersion >= VK_API_VERSION_1_2 && ShaderModel >= ShaderVersion{6, 3})
        {
            // Ray tracing requires SM 6.3 and Vulkan 1.2
            // Inline ray tracing requires SM 6.5 and Vulkan 1.2
            DxilArgs.push_back(L"-fspv-target-env=vulkan1.2");
        }
        else if (m_APIVersion >= VK_API_VERSION_1_1)
        {
            // Wave operations require SM 6.0 and Vulkan 1.1
            DxilArgs.push_back(L"-fspv-target-env=vulkan1.1");
        }
    }
    else
    {
        UNEXPECTED("Unknown compiler target");
    }
    DxilArgs.push_back((ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR) != 0 ?
                           DXC_ARG_PACK_MATRIX_ROW_MAJOR :
                           DXC_ARG_PACK_MATRIX_COLUMN_MAJOR);

    CComPtr<IDxcBlob> pDXIL;
    CComPtr<IDxcBlob> pDxcLog;

    IDXCompiler::CompileAttribs CA;

    String Source{Preamble != nullptr ? Preamble : ""};
    Source.append(BuildHLSLSourceString(ShaderCI));

    DxcDefine Defines[] = {{L"DXCOMPILER", L"1"}};

    CA.Source                     = Source.c_str();
    CA.SourceLength               = static_cast<Uint32>(Source.length());
    CA.EntryPoint                 = wstrEntryPoint.c_str();
    CA.Profile                    = wstrProfile.c_str();
    CA.pDefines                   = Defines;
    CA.DefinesCount               = _countof(Defines);
    CA.pArgs                      = DxilArgs.data();
    CA.ArgsCount                  = static_cast<Uint32>(DxilArgs.size());
    CA.pShaderSourceStreamFactory = ShaderCI.pShaderSourceStreamFactory;
    CA.ppBlobOut                  = &pDXIL;
    CA.ppCompilerOutput           = &pDxcLog;

    bool result = Compile(CA);
    HandleHLSLCompilerResult(result, pDxcLog.p, Source, ShaderCI.Desc.Name, ppCompilerOutput);

    if (result && pDXIL && pDXIL->GetBufferSize() > 0)
    {
        if (pByteCode != nullptr)
            pByteCode->assign(static_cast<uint32_t*>(pDXIL->GetBufferPointer()),
                              static_cast<uint32_t*>(pDXIL->GetBufferPointer()) + pDXIL->GetBufferSize() / sizeof(uint32_t));

        if (ppByteCodeBlob != nullptr)
            *ppByteCodeBlob = pDXIL.Detach();
    }
}